

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

void __thiscall
ServerService::startControlServiceWithResult
          (ServerService *this,int fd,_func_byte_ptr_int_byte_ptr *pFunction)

{
  sockaddr_storage clientDetails_00;
  int iVar1;
  ostream *this_00;
  byte *data;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  unsigned_long uStack_678;
  ServerSegment *local_670;
  ServerSegment *segment;
  byte buffer [1472];
  sockaddr_storage clientDetails;
  socklen_t clientLength;
  _func_byte_ptr_int_byte_ptr *pFunction_local;
  int fd_local;
  ServerService *this_local;
  
  memset(&segment,0,0x5c0);
  clientDetails.__ss_align._4_4_ = 0x80;
  iVar1 = ServerSocketUDP::getSocket(this->serverSocketUDP);
  recvfrom(iVar1,&segment,0x5c0,0,(sockaddr *)(buffer + 0x5b8),
           (socklen_t *)((long)&clientDetails.__ss_align + 4));
  local_670 = parseRequest(this,(byte *)&segment);
  if ((local_670->data != (byte *)0x0) && (local_670->ackFlag == 'N')) {
    std::operator<<((ostream *)&std::cout,"received: ");
    this_00 = std::operator<<((ostream *)&std::cout,(char *)local_670->data);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    data = (*pFunction)(fd,local_670->data);
    iVar1 = ServerSocketUDP::getSocket(this->serverSocketUDP);
    memcpy(&local_6f0,buffer + 0x5b8,0x80);
    clientDetails_00.__ss_padding[6] = (undefined1)uStack_6e8;
    clientDetails_00.__ss_padding[7] = uStack_6e8._1_1_;
    clientDetails_00.__ss_padding[8] = uStack_6e8._2_1_;
    clientDetails_00.__ss_padding[9] = uStack_6e8._3_1_;
    clientDetails_00.__ss_padding[10] = uStack_6e8._4_1_;
    clientDetails_00.__ss_padding[0xb] = uStack_6e8._5_1_;
    clientDetails_00.__ss_padding[0xc] = uStack_6e8._6_1_;
    clientDetails_00.__ss_padding[0xd] = uStack_6e8._7_1_;
    clientDetails_00.ss_family = (undefined2)local_6f0;
    clientDetails_00.__ss_padding[0] = local_6f0._2_1_;
    clientDetails_00.__ss_padding[1] = local_6f0._3_1_;
    clientDetails_00.__ss_padding[2] = local_6f0._4_1_;
    clientDetails_00.__ss_padding[3] = local_6f0._5_1_;
    clientDetails_00.__ss_padding[4] = local_6f0._6_1_;
    clientDetails_00.__ss_padding[5] = local_6f0._7_1_;
    clientDetails_00.__ss_padding[0xe] = (undefined1)local_6e0;
    clientDetails_00.__ss_padding[0xf] = local_6e0._1_1_;
    clientDetails_00.__ss_padding[0x10] = local_6e0._2_1_;
    clientDetails_00.__ss_padding[0x11] = local_6e0._3_1_;
    clientDetails_00.__ss_padding[0x12] = local_6e0._4_1_;
    clientDetails_00.__ss_padding[0x13] = local_6e0._5_1_;
    clientDetails_00.__ss_padding[0x14] = local_6e0._6_1_;
    clientDetails_00.__ss_padding[0x15] = local_6e0._7_1_;
    clientDetails_00.__ss_padding[0x16] = (undefined1)uStack_6d8;
    clientDetails_00.__ss_padding[0x17] = uStack_6d8._1_1_;
    clientDetails_00.__ss_padding[0x18] = uStack_6d8._2_1_;
    clientDetails_00.__ss_padding[0x19] = uStack_6d8._3_1_;
    clientDetails_00.__ss_padding[0x1a] = uStack_6d8._4_1_;
    clientDetails_00.__ss_padding[0x1b] = uStack_6d8._5_1_;
    clientDetails_00.__ss_padding[0x1c] = uStack_6d8._6_1_;
    clientDetails_00.__ss_padding[0x1d] = uStack_6d8._7_1_;
    clientDetails_00.__ss_padding[0x1e] = (undefined1)local_6d0;
    clientDetails_00.__ss_padding[0x1f] = local_6d0._1_1_;
    clientDetails_00.__ss_padding[0x20] = local_6d0._2_1_;
    clientDetails_00.__ss_padding[0x21] = local_6d0._3_1_;
    clientDetails_00.__ss_padding[0x22] = local_6d0._4_1_;
    clientDetails_00.__ss_padding[0x23] = local_6d0._5_1_;
    clientDetails_00.__ss_padding[0x24] = local_6d0._6_1_;
    clientDetails_00.__ss_padding[0x25] = local_6d0._7_1_;
    clientDetails_00.__ss_padding[0x26] = (undefined1)uStack_6c8;
    clientDetails_00.__ss_padding[0x27] = uStack_6c8._1_1_;
    clientDetails_00.__ss_padding[0x28] = uStack_6c8._2_1_;
    clientDetails_00.__ss_padding[0x29] = uStack_6c8._3_1_;
    clientDetails_00.__ss_padding[0x2a] = uStack_6c8._4_1_;
    clientDetails_00.__ss_padding[0x2b] = uStack_6c8._5_1_;
    clientDetails_00.__ss_padding[0x2c] = uStack_6c8._6_1_;
    clientDetails_00.__ss_padding[0x2d] = uStack_6c8._7_1_;
    clientDetails_00.__ss_padding[0x2e] = (undefined1)local_6c0;
    clientDetails_00.__ss_padding[0x2f] = local_6c0._1_1_;
    clientDetails_00.__ss_padding[0x30] = local_6c0._2_1_;
    clientDetails_00.__ss_padding[0x31] = local_6c0._3_1_;
    clientDetails_00.__ss_padding[0x32] = local_6c0._4_1_;
    clientDetails_00.__ss_padding[0x33] = local_6c0._5_1_;
    clientDetails_00.__ss_padding[0x34] = local_6c0._6_1_;
    clientDetails_00.__ss_padding[0x35] = local_6c0._7_1_;
    clientDetails_00.__ss_padding[0x36] = (undefined1)uStack_6b8;
    clientDetails_00.__ss_padding[0x37] = uStack_6b8._1_1_;
    clientDetails_00.__ss_padding[0x38] = uStack_6b8._2_1_;
    clientDetails_00.__ss_padding[0x39] = uStack_6b8._3_1_;
    clientDetails_00.__ss_padding[0x3a] = uStack_6b8._4_1_;
    clientDetails_00.__ss_padding[0x3b] = uStack_6b8._5_1_;
    clientDetails_00.__ss_padding[0x3c] = uStack_6b8._6_1_;
    clientDetails_00.__ss_padding[0x3d] = uStack_6b8._7_1_;
    clientDetails_00.__ss_padding[0x3e] = (undefined1)local_6b0;
    clientDetails_00.__ss_padding[0x3f] = local_6b0._1_1_;
    clientDetails_00.__ss_padding[0x40] = local_6b0._2_1_;
    clientDetails_00.__ss_padding[0x41] = local_6b0._3_1_;
    clientDetails_00.__ss_padding[0x42] = local_6b0._4_1_;
    clientDetails_00.__ss_padding[0x43] = local_6b0._5_1_;
    clientDetails_00.__ss_padding[0x44] = local_6b0._6_1_;
    clientDetails_00.__ss_padding[0x45] = local_6b0._7_1_;
    clientDetails_00.__ss_padding[0x46] = (undefined1)uStack_6a8;
    clientDetails_00.__ss_padding[0x47] = uStack_6a8._1_1_;
    clientDetails_00.__ss_padding[0x48] = uStack_6a8._2_1_;
    clientDetails_00.__ss_padding[0x49] = uStack_6a8._3_1_;
    clientDetails_00.__ss_padding[0x4a] = uStack_6a8._4_1_;
    clientDetails_00.__ss_padding[0x4b] = uStack_6a8._5_1_;
    clientDetails_00.__ss_padding[0x4c] = uStack_6a8._6_1_;
    clientDetails_00.__ss_padding[0x4d] = uStack_6a8._7_1_;
    clientDetails_00.__ss_padding[0x4e] = (undefined1)local_6a0;
    clientDetails_00.__ss_padding[0x4f] = local_6a0._1_1_;
    clientDetails_00.__ss_padding[0x50] = local_6a0._2_1_;
    clientDetails_00.__ss_padding[0x51] = local_6a0._3_1_;
    clientDetails_00.__ss_padding[0x52] = local_6a0._4_1_;
    clientDetails_00.__ss_padding[0x53] = local_6a0._5_1_;
    clientDetails_00.__ss_padding[0x54] = local_6a0._6_1_;
    clientDetails_00.__ss_padding[0x55] = local_6a0._7_1_;
    clientDetails_00.__ss_padding[0x56] = (undefined1)uStack_698;
    clientDetails_00.__ss_padding[0x57] = uStack_698._1_1_;
    clientDetails_00.__ss_padding[0x58] = uStack_698._2_1_;
    clientDetails_00.__ss_padding[0x59] = uStack_698._3_1_;
    clientDetails_00.__ss_padding[0x5a] = uStack_698._4_1_;
    clientDetails_00.__ss_padding[0x5b] = uStack_698._5_1_;
    clientDetails_00.__ss_padding[0x5c] = uStack_698._6_1_;
    clientDetails_00.__ss_padding[0x5d] = uStack_698._7_1_;
    clientDetails_00.__ss_padding[0x5e] = (undefined1)local_690;
    clientDetails_00.__ss_padding[0x5f] = local_690._1_1_;
    clientDetails_00.__ss_padding[0x60] = local_690._2_1_;
    clientDetails_00.__ss_padding[0x61] = local_690._3_1_;
    clientDetails_00.__ss_padding[0x62] = local_690._4_1_;
    clientDetails_00.__ss_padding[99] = local_690._5_1_;
    clientDetails_00.__ss_padding[100] = local_690._6_1_;
    clientDetails_00.__ss_padding[0x65] = local_690._7_1_;
    clientDetails_00.__ss_padding[0x66] = (undefined1)uStack_688;
    clientDetails_00.__ss_padding[0x67] = uStack_688._1_1_;
    clientDetails_00.__ss_padding[0x68] = uStack_688._2_1_;
    clientDetails_00.__ss_padding[0x69] = uStack_688._3_1_;
    clientDetails_00.__ss_padding[0x6a] = uStack_688._4_1_;
    clientDetails_00.__ss_padding[0x6b] = uStack_688._5_1_;
    clientDetails_00.__ss_padding[0x6c] = uStack_688._6_1_;
    clientDetails_00.__ss_padding[0x6d] = uStack_688._7_1_;
    clientDetails_00.__ss_padding[0x6e] = (undefined1)local_680;
    clientDetails_00.__ss_padding[0x6f] = local_680._1_1_;
    clientDetails_00.__ss_padding[0x70] = local_680._2_1_;
    clientDetails_00.__ss_padding[0x71] = local_680._3_1_;
    clientDetails_00.__ss_padding[0x72] = local_680._4_1_;
    clientDetails_00.__ss_padding[0x73] = local_680._5_1_;
    clientDetails_00.__ss_padding[0x74] = local_680._6_1_;
    clientDetails_00.__ss_padding[0x75] = local_680._7_1_;
    clientDetails_00.__ss_align = uStack_678;
    sendSegments(this,data,iVar1,clientDetails_00,this->receiverWindowSize);
  }
  return;
}

Assistant:

void ServerService::startControlServiceWithResult(int fd, byte* (* pFunction)(int, byte* )) {
    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    clientLength = sizeof(clientDetails);
    recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
    ServerSegment *segment = parseRequest(buffer);

    if (segment->data && segment->ackFlag == 'N') {
        cout << "received: ";
        cout << (char *) segment->data << endl;
        sendSegments(pFunction(fd, segment->data), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize);
    }
}